

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostStepRegistry.cpp
# Opt level: O0

void Assimp::GetPostProcessingStepInstanceList
               (vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_> *out)

{
  vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_> *pvVar1;
  value_type pBVar2;
  RemoveVCProcess *this;
  RemoveRedundantMatsProcess *this_00;
  EmbedTexturesProcess *this_01;
  FindInstancesProcess *this_02;
  OptimizeGraphProcess *this_03;
  TextureTransformStep *this_04;
  ScaleProcess *this_05;
  PretransformVertices *this_06;
  FindDegeneratesProcess *this_07;
  SortByPTypeProcess *this_08;
  FindInvalidDataProcess *this_09;
  OptimizeMeshesProcess *this_10;
  SplitByBoneCountProcess *this_11;
  SplitLargeMeshesProcess_Triangle *this_12;
  GenFaceNormalsProcess *this_13;
  GenVertexNormalsProcess *this_14;
  CalcTangentsProcess *this_15;
  SplitLargeMeshesProcess_Vertex *this_16;
  DeboneProcess *this_17;
  LimitBoneWeightsProcess *this_18;
  ImproveCacheLocalityProcess *this_19;
  value_type local_120;
  ImproveCacheLocalityProcess *local_118;
  LimitBoneWeightsProcess *local_110;
  DeboneProcess *local_108;
  SplitLargeMeshesProcess_Vertex *local_100;
  value_type local_f8;
  value_type local_f0;
  CalcTangentsProcess *local_e8;
  GenVertexNormalsProcess *local_e0;
  value_type local_d8;
  GenFaceNormalsProcess *local_d0;
  value_type local_c8;
  SplitLargeMeshesProcess_Triangle *local_c0;
  SplitByBoneCountProcess *local_b8;
  value_type local_b0;
  OptimizeMeshesProcess *local_a8;
  FindInvalidDataProcess *local_a0;
  SortByPTypeProcess *local_98;
  FindDegeneratesProcess *local_90;
  value_type local_88;
  PretransformVertices *local_80;
  ScaleProcess *local_78;
  TextureTransformStep *local_70;
  value_type local_68;
  OptimizeGraphProcess *local_60;
  FindInstancesProcess *local_58;
  EmbedTexturesProcess *local_50;
  RemoveRedundantMatsProcess *local_48;
  RemoveVCProcess *local_40;
  value_type local_38;
  value_type local_30 [3];
  value_type local_18;
  vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_> *local_10;
  vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_> *out_local;
  
  local_10 = out;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::reserve(out,0x1f);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x18);
  MakeLeftHandedProcess::MakeLeftHandedProcess((MakeLeftHandedProcess *)pBVar2);
  local_18 = pBVar2;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,&local_18);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x18);
  FlipUVsProcess::FlipUVsProcess((FlipUVsProcess *)pBVar2);
  local_30[0] = pBVar2;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,local_30);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x18);
  FlipWindingOrderProcess::FlipWindingOrderProcess((FlipWindingOrderProcess *)pBVar2);
  local_38 = pBVar2;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,&local_38);
  pvVar1 = local_10;
  this = (RemoveVCProcess *)operator_new(0x28);
  RemoveVCProcess::RemoveVCProcess(this);
  local_40 = this;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_40);
  pvVar1 = local_10;
  this_00 = (RemoveRedundantMatsProcess *)operator_new(0x38);
  RemoveRedundantMatsProcess::RemoveRedundantMatsProcess(this_00);
  local_48 = this_00;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_48);
  pvVar1 = local_10;
  this_01 = (EmbedTexturesProcess *)operator_new(0x38);
  EmbedTexturesProcess::EmbedTexturesProcess(this_01);
  local_50 = this_01;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_50);
  pvVar1 = local_10;
  this_02 = (FindInstancesProcess *)operator_new(0x20);
  FindInstancesProcess::FindInstancesProcess(this_02);
  local_58 = this_02;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_58);
  pvVar1 = local_10;
  this_03 = (OptimizeGraphProcess *)operator_new(0x90);
  OptimizeGraphProcess::OptimizeGraphProcess(this_03);
  local_60 = this_03;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_60);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x18);
  ComputeUVMappingProcess::ComputeUVMappingProcess((ComputeUVMappingProcess *)pBVar2);
  local_68 = pBVar2;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,&local_68);
  pvVar1 = local_10;
  this_04 = (TextureTransformStep *)operator_new(0x20);
  TextureTransformStep::TextureTransformStep(this_04);
  local_70 = this_04;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_70);
  pvVar1 = local_10;
  this_05 = (ScaleProcess *)operator_new(0x20);
  ScaleProcess::ScaleProcess(this_05);
  local_78 = this_05;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_78);
  pvVar1 = local_10;
  this_06 = (PretransformVertices *)operator_new(0x60);
  PretransformVertices::PretransformVertices(this_06);
  local_80 = this_06;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_80);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x18);
  TriangulateProcess::TriangulateProcess((TriangulateProcess *)pBVar2);
  local_88 = pBVar2;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,&local_88);
  pvVar1 = local_10;
  this_07 = (FindDegeneratesProcess *)operator_new(0x20);
  FindDegeneratesProcess::FindDegeneratesProcess(this_07);
  local_90 = this_07;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_90);
  pvVar1 = local_10;
  this_08 = (SortByPTypeProcess *)operator_new(0x20);
  SortByPTypeProcess::SortByPTypeProcess(this_08);
  local_98 = this_08;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_98);
  pvVar1 = local_10;
  this_09 = (FindInvalidDataProcess *)operator_new(0x20);
  FindInvalidDataProcess::FindInvalidDataProcess(this_09);
  local_a0 = this_09;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_a0);
  pvVar1 = local_10;
  this_10 = (OptimizeMeshesProcess *)operator_new(0x78);
  OptimizeMeshesProcess::OptimizeMeshesProcess(this_10);
  local_a8 = this_10;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_a8);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x18);
  FixInfacingNormalsProcess::FixInfacingNormalsProcess((FixInfacingNormalsProcess *)pBVar2);
  local_b0 = pBVar2;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,&local_b0);
  pvVar1 = local_10;
  this_11 = (SplitByBoneCountProcess *)operator_new(0x38);
  SplitByBoneCountProcess::SplitByBoneCountProcess(this_11);
  local_b8 = this_11;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_b8);
  pvVar1 = local_10;
  this_12 = (SplitLargeMeshesProcess_Triangle *)operator_new(0x20);
  SplitLargeMeshesProcess_Triangle::SplitLargeMeshesProcess_Triangle(this_12);
  local_c0 = this_12;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_c0);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x18);
  DropFaceNormalsProcess::DropFaceNormalsProcess((DropFaceNormalsProcess *)pBVar2);
  local_c8 = pBVar2;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,&local_c8);
  pvVar1 = local_10;
  this_13 = (GenFaceNormalsProcess *)operator_new(0x20);
  GenFaceNormalsProcess::GenFaceNormalsProcess(this_13);
  local_d0 = this_13;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_d0);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x18);
  ((BaseProcess *)&pBVar2->_vptr_BaseProcess)->_vptr_BaseProcess = (_func_int **)0x0;
  pBVar2->shared = (SharedPostProcessInfo *)0x0;
  pBVar2->progress = (ProgressHandler *)0x0;
  ComputeSpatialSortProcess::ComputeSpatialSortProcess((ComputeSpatialSortProcess *)pBVar2);
  local_d8 = pBVar2;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,&local_d8);
  pvVar1 = local_10;
  this_14 = (GenVertexNormalsProcess *)operator_new(0x20);
  GenVertexNormalsProcess::GenVertexNormalsProcess(this_14);
  local_e0 = this_14;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_e0);
  pvVar1 = local_10;
  this_15 = (CalcTangentsProcess *)operator_new(0x20);
  CalcTangentsProcess::CalcTangentsProcess(this_15);
  local_e8 = this_15;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_e8);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x18);
  JoinVerticesProcess::JoinVerticesProcess((JoinVerticesProcess *)pBVar2);
  local_f0 = pBVar2;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,&local_f0);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x18);
  ((BaseProcess *)&pBVar2->_vptr_BaseProcess)->_vptr_BaseProcess = (_func_int **)0x0;
  pBVar2->shared = (SharedPostProcessInfo *)0x0;
  pBVar2->progress = (ProgressHandler *)0x0;
  DestroySpatialSortProcess::DestroySpatialSortProcess((DestroySpatialSortProcess *)pBVar2);
  local_f8 = pBVar2;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,&local_f8);
  pvVar1 = local_10;
  this_16 = (SplitLargeMeshesProcess_Vertex *)operator_new(0x20);
  SplitLargeMeshesProcess_Vertex::SplitLargeMeshesProcess_Vertex(this_16);
  local_100 = this_16;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_100);
  pvVar1 = local_10;
  this_17 = (DeboneProcess *)operator_new(0x40);
  DeboneProcess::DeboneProcess(this_17);
  local_108 = this_17;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_108);
  pvVar1 = local_10;
  this_18 = (LimitBoneWeightsProcess *)operator_new(0x20);
  LimitBoneWeightsProcess::LimitBoneWeightsProcess(this_18);
  local_110 = this_18;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_110);
  pvVar1 = local_10;
  this_19 = (ImproveCacheLocalityProcess *)operator_new(0x20);
  ImproveCacheLocalityProcess::ImproveCacheLocalityProcess(this_19);
  local_118 = this_19;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,(value_type *)&local_118);
  pvVar1 = local_10;
  pBVar2 = (value_type)operator_new(0x18);
  GenBoundingBoxesProcess::GenBoundingBoxesProcess((GenBoundingBoxesProcess *)pBVar2);
  local_120 = pBVar2;
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
            (pvVar1,&local_120);
  return;
}

Assistant:

void GetPostProcessingStepInstanceList(std::vector< BaseProcess* >& out)
{
    // ----------------------------------------------------------------------------
    // Add an instance of each post processing step here in the order
    // of sequence it is executed. Steps that are added here are not
    // validated - as RegisterPPStep() does - all dependencies must be given.
    // ----------------------------------------------------------------------------
    out.reserve(31);
#if (!defined ASSIMP_BUILD_NO_MAKELEFTHANDED_PROCESS)
    out.push_back( new MakeLeftHandedProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_FLIPUVS_PROCESS)
    out.push_back( new FlipUVsProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_FLIPWINDINGORDER_PROCESS)
    out.push_back( new FlipWindingOrderProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_REMOVEVC_PROCESS)
    out.push_back( new RemoveVCProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_REMOVE_REDUNDANTMATERIALS_PROCESS)
    out.push_back( new RemoveRedundantMatsProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_EMBEDTEXTURES_PROCESS)
    out.push_back( new EmbedTexturesProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_FINDINSTANCES_PROCESS)
    out.push_back( new FindInstancesProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_OPTIMIZEGRAPH_PROCESS)
    out.push_back( new OptimizeGraphProcess());
#endif
#ifndef ASSIMP_BUILD_NO_GENUVCOORDS_PROCESS
    out.push_back( new ComputeUVMappingProcess());
#endif
#ifndef ASSIMP_BUILD_NO_TRANSFORMTEXCOORDS_PROCESS
    out.push_back( new TextureTransformStep());
#endif
#if (!defined ASSIMP_BUILD_NO_GLOBALSCALE_PROCESS)
    out.push_back( new ScaleProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_PRETRANSFORMVERTICES_PROCESS)
    out.push_back( new PretransformVertices());
#endif
#if (!defined ASSIMP_BUILD_NO_TRIANGULATE_PROCESS)
    out.push_back( new TriangulateProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_FINDDEGENERATES_PROCESS)
    //find degenerates should run after triangulation (to sort out small
    //generated triangles) but before sort by p types (in case there are lines
    //and points generated and inserted into a mesh)
    out.push_back( new FindDegeneratesProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_SORTBYPTYPE_PROCESS)
    out.push_back( new SortByPTypeProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_FINDINVALIDDATA_PROCESS)
    out.push_back( new FindInvalidDataProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_OPTIMIZEMESHES_PROCESS)
    out.push_back( new OptimizeMeshesProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_FIXINFACINGNORMALS_PROCESS)
    out.push_back( new FixInfacingNormalsProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_SPLITBYBONECOUNT_PROCESS)
    out.push_back( new SplitByBoneCountProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_SPLITLARGEMESHES_PROCESS)
    out.push_back( new SplitLargeMeshesProcess_Triangle());
#endif
#if (!defined ASSIMP_BUILD_NO_GENFACENORMALS_PROCESS)
    out.push_back( new DropFaceNormalsProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_GENFACENORMALS_PROCESS)
    out.push_back( new GenFaceNormalsProcess());
#endif
    // .........................................................................
    // DON'T change the order of these five ..
    // XXX this is actually a design weakness that dates back to the time
    // when Importer would maintain the postprocessing step list exclusively.
    // Now that others access it too, we need a better solution.
    out.push_back( new ComputeSpatialSortProcess());
    // .........................................................................

#if (!defined ASSIMP_BUILD_NO_GENVERTEXNORMALS_PROCESS)
    out.push_back( new GenVertexNormalsProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_CALCTANGENTS_PROCESS)
    out.push_back( new CalcTangentsProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_JOINVERTICES_PROCESS)
    out.push_back( new JoinVerticesProcess());
#endif

    // .........................................................................
    out.push_back( new DestroySpatialSortProcess());
    // .........................................................................

#if (!defined ASSIMP_BUILD_NO_SPLITLARGEMESHES_PROCESS)
    out.push_back( new SplitLargeMeshesProcess_Vertex());
#endif
#if (!defined ASSIMP_BUILD_NO_DEBONE_PROCESS)
    out.push_back( new DeboneProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_LIMITBONEWEIGHTS_PROCESS)
    out.push_back( new LimitBoneWeightsProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_IMPROVECACHELOCALITY_PROCESS)
    out.push_back( new ImproveCacheLocalityProcess());
#endif
#if (!defined ASSIMP_BUILD_NO_GENBOUNDINGBOXES_PROCESS)
    out.push_back(new GenBoundingBoxesProcess);
#endif
}